

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Liby::Buffer::reserve(Buffer *this,off_t minSize)

{
  long minSize_00;
  
  minSize_00 = this->capacity_;
  if (minSize < minSize_00) {
    return;
  }
  do {
    minSize_00 = minSize_00 * 2;
  } while (minSize_00 < minSize);
  resize(this,minSize_00);
  return;
}

Assistant:

void Buffer::reserve(off_t minSize) {
    if (minSize < capacity_)
        return;
    off_t newSize = capacity_ << 1;
    while (newSize < minSize)
        newSize = newSize << 1;
    resize(newSize);
}